

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_asm.c
# Opt level: O0

void asm_snap_alloc1(ASMState *as,IRRef ref)

{
  int iVar1;
  uint uVar2;
  Reg RVar3;
  uint in_ESI;
  ASMState *in_RDI;
  Reg r;
  IRIns *irc;
  RegSet allow;
  IRIns *irs;
  IRIns *ir;
  IRIns *in_stack_ffffffffffffffb8;
  undefined3 in_stack_ffffffffffffffc0;
  RegSet allow_00;
  IRRef in_stack_ffffffffffffffc4;
  IRIns *in_stack_ffffffffffffffc8;
  IRIns *local_28;
  IRRef ref_00;
  IRIns *ira;
  undefined4 in_stack_ffffffffffffffe8;
  
  ira = in_RDI->ir + in_ESI;
  if ((((0x7fff < in_ESI) && (((ira->field_1).r & 0x80) != 0)) && ((ira->field_1).s == '\0')) &&
     ((ira->field_1).r != 0xfd)) {
    ref_00 = (IRRef)((ulong)ira >> 0x20);
    if ((ira->field_1).r == 0xfe) {
      (ira->field_1).r = 0xfd;
      if ((ira->field_1).o == 'Q') {
        asm_snap_alloc1((ASMState *)CONCAT44(in_ESI,in_stack_ffffffffffffffe8),ref_00);
      }
      else {
        for (local_28 = in_RDI->ir + (in_RDI->snapref - 1); ira < local_28; local_28 = local_28 + -1
            ) {
          if (((local_28->field_1).r == 0xfe) &&
             (iVar1 = asm_sunk_store(in_RDI,ira,local_28), iVar1 != 0)) {
            asm_snap_alloc1((ASMState *)CONCAT44(in_ESI,in_stack_ffffffffffffffe8),
                            (IRRef)((ulong)ira >> 0x20));
          }
        }
      }
    }
    else if (((ira->field_1).o == 'U') && ((ira->field_0).op2 == 0x1d3)) {
      for (in_stack_ffffffffffffffc8 = in_RDI->ir + in_RDI->curins; ira < in_stack_ffffffffffffffc8;
          in_stack_ffffffffffffffc8 = in_stack_ffffffffffffffc8 + -1) {
        if ((((in_stack_ffffffffffffffc8->field_0).op1 == in_ESI) ||
            ((in_stack_ffffffffffffffc8->field_0).op2 == in_ESI)) &&
           (((in_stack_ffffffffffffffc8->field_1).r != 0xfe &&
            ((in_stack_ffffffffffffffc8->field_1).r != 0xfd)))) goto LAB_0017441f;
      }
      asm_snap_alloc1((ASMState *)CONCAT44(in_ESI,in_stack_ffffffffffffffe8),ref_00);
    }
    else {
LAB_0017441f:
      allow_00 = CONCAT13(1,in_stack_ffffffffffffffc0);
      if (((ira->field_1).t.irt & 0x1f) != 0xe) {
        allow_00 = CONCAT13(((ira->field_1).t.irt & 0x1f) == 0xd,in_stack_ffffffffffffffc0);
      }
      uVar2 = 0xffef;
      if ((char)(allow_00 >> 0x18) != '\0') {
        uVar2 = 0xffff0000;
      }
      if (((in_RDI->freeset & uVar2) == 0) &&
         ((uVar2 != 0xffff0000 || (iVar1 = asm_snap_canremat(in_RDI), iVar1 == 0)))) {
        ra_spill((ASMState *)CONCAT44(in_stack_ffffffffffffffc4,allow_00),in_stack_ffffffffffffffb8)
        ;
      }
      else {
        RVar3 = ra_allocref((ASMState *)&in_stack_ffffffffffffffc8->field_0,
                            in_stack_ffffffffffffffc4,allow_00);
        if (((ira->field_1).t.irt & 0x40) == 0) {
          in_RDI->weakset = 1 << ((byte)RVar3 & 0x1f) | in_RDI->weakset;
        }
        if (in_RDI->mcp < in_RDI->mclim) {
          asm_mclimit((ASMState *)0x17450f);
        }
      }
    }
  }
  return;
}

Assistant:

static void asm_snap_alloc1(ASMState *as, IRRef ref)
{
  IRIns *ir = IR(ref);
  if (!irref_isk(ref) && (!(ra_used(ir) || ir->r == RID_SUNK))) {
    if (ir->r == RID_SINK) {
      ir->r = RID_SUNK;
#if LJ_HASFFI
      if (ir->o == IR_CNEWI) {  /* Allocate CNEWI value. */
	asm_snap_alloc1(as, ir->op2);
	if (LJ_32 && (ir+1)->o == IR_HIOP)
	  asm_snap_alloc1(as, (ir+1)->op2);
      } else
#endif
      {  /* Allocate stored values for TNEW, TDUP and CNEW. */
	IRIns *irs;
	lua_assert(ir->o == IR_TNEW || ir->o == IR_TDUP || ir->o == IR_CNEW);
	for (irs = IR(as->snapref-1); irs > ir; irs--)
	  if (irs->r == RID_SINK && asm_sunk_store(as, ir, irs)) {
	    lua_assert(irs->o == IR_ASTORE || irs->o == IR_HSTORE ||
		       irs->o == IR_FSTORE || irs->o == IR_XSTORE);
	    asm_snap_alloc1(as, irs->op2);
	    if (LJ_32 && (irs+1)->o == IR_HIOP)
	      asm_snap_alloc1(as, (irs+1)->op2);
	  }
      }
    } else {
      RegSet allow;
      if (ir->o == IR_CONV && ir->op2 == IRCONV_NUM_INT) {
	IRIns *irc;
	for (irc = IR(as->curins); irc > ir; irc--)
	  if ((irc->op1 == ref || irc->op2 == ref) &&
	      !(irc->r == RID_SINK || irc->r == RID_SUNK))
	    goto nosink;  /* Don't sink conversion if result is used. */
	asm_snap_alloc1(as, ir->op1);
	return;
      }
    nosink:
      allow = (!LJ_SOFTFP && irt_isfp(ir->t)) ? RSET_FPR : RSET_GPR;
      if ((as->freeset & allow) ||
	       (allow == RSET_FPR && asm_snap_canremat(as))) {
	/* Get a weak register if we have a free one or can rematerialize. */
	Reg r = ra_allocref(as, ref, allow);  /* Allocate a register. */
	if (!irt_isphi(ir->t))
	  ra_weak(as, r);  /* But mark it as weakly referenced. */
	checkmclim(as);
	RA_DBGX((as, "snapreg   $f $r", ref, ir->r));
      } else {
	ra_spill(as, ir);  /* Otherwise force a spill slot. */
	RA_DBGX((as, "snapspill $f $s", ref, ir->s));
      }
    }
  }
}